

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_core.cpp
# Opt level: O3

void __thiscall so_5::impl::layer_core_t::finish(layer_core_t *this)

{
  pointer ptVar1;
  pointer ptVar2;
  
  ptVar1 = (this->m_extra_layers).
           super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->m_extra_layers).
                super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    (*((ptVar2->m_layer).super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_layer_t[3])();
  }
  wait_extra_layers(this);
  ptVar2 = (this->m_default_layers).
           super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (this->m_default_layers).
           super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar2 != ptVar1) {
    do {
      (*((ptVar2->m_layer).super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_layer_t[3])();
      ptVar2 = ptVar2 + 1;
    } while (ptVar2 != ptVar1);
    ptVar1 = (this->m_default_layers).
             super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ptVar2 = (this->m_default_layers).
                  super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                  ._M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1)
    {
      (*((ptVar2->m_layer).super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_layer_t[4])();
    }
  }
  return;
}

Assistant:

void
layer_core_t::finish()
{
	// Shutdown and wait extra layers.
	shutdown_extra_layers();
	wait_extra_layers();

	// Shutdown and wait default layers.
	shutdown_default_layers();
	wait_default_layers();
}